

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_constant.cpp
# Opt level: O2

void duckdb::ConstantFillFunction<duckdb::uhugeint_t>
               (ColumnSegment *segment,Vector *result,idx_t start_idx,idx_t count)

{
  data_ptr_t pdVar1;
  uint64_t *puVar2;
  bool bVar3;
  uhugeint_t uVar4;
  
  pdVar1 = result->data;
  uVar4 = NumericStats::GetMin<duckdb::uhugeint_t>(&(segment->stats).statistics);
  puVar2 = (uint64_t *)(pdVar1 + start_idx * 0x10 + 8);
  while (bVar3 = count != 0, count = count - 1, bVar3) {
    puVar2[-1] = uVar4.lower;
    *puVar2 = uVar4.upper;
    puVar2 = puVar2 + 2;
  }
  return;
}

Assistant:

void ConstantFillFunction(ColumnSegment &segment, Vector &result, idx_t start_idx, idx_t count) {
	auto &nstats = segment.stats.statistics;

	auto data = FlatVector::GetData<T>(result);
	auto constant_value = NumericStats::GetMin<T>(nstats);
	for (idx_t i = 0; i < count; i++) {
		data[start_idx + i] = constant_value;
	}
}